

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_param.c
# Opt level: O0

int param_get_com(int cs,double *resdata,SpurUserParamsPtr spur)

{
  double *pdVar1;
  SpurUserParamsPtr spur_local;
  double *resdata_local;
  int cs_local;
  
  if ((cs < 0) || (0x48 < cs)) {
    resdata_local._4_4_ = 0;
  }
  else {
    pdVar1 = pp(cs,MOTOR_RIGHT);
    *resdata = *pdVar1;
    pdVar1 = pp(cs,MOTOR_LEFT);
    resdata[1] = *pdVar1;
    resdata_local._4_4_ = cs;
  }
  return resdata_local._4_4_;
}

Assistant:

int param_get_com(int cs, double* resdata, SpurUserParamsPtr spur)
{
  if (cs >= 0 && cs < YP_PARAM_NUM)
  {
    resdata[0] = *pp(cs, 0);
    resdata[1] = *pp(cs, 1);
    return cs;
  }
  else
  {
    return 0;
  }
}